

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O3

bool __thiscall
tinyusdz::Stage::find_prim_by_prim_id(Stage *this,uint64_t prim_id,Prim **prim,string *err)

{
  _Rb_tree_header *p_Var1;
  pointer pPVar2;
  Prim *pPVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  mapped_type *ppPVar6;
  _Base_ptr p_Var7;
  string *in_R8;
  pointer root;
  Prim *p;
  Prim *local_40;
  uint64_t local_38;
  
  local_38 = prim_id;
  if (prim_id == 0) {
    if (err != (string *)0x0) {
      std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x249e81);
      return false;
    }
  }
  else {
    if (this->_prim_id_dirty == true) {
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
      ::_M_erase(&(this->_prim_id_cache)._M_t,
                 (_Link_type)
                 (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      p_Var1 = &(this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header;
      (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      this->_prim_id_dirty = false;
    }
    else {
      p_Var7 = (this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var7 != (_Base_ptr)0x0) {
        p_Var1 = &(this->_prim_id_cache)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = &p_Var1->_M_header;
        do {
          if (*(ulong *)(p_Var7 + 1) >= prim_id) {
            p_Var5 = p_Var7;
          }
          p_Var7 = (&p_Var7->_M_left)[*(ulong *)(p_Var7 + 1) < prim_id];
        } while (p_Var7 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var5 != p_Var1) && (*(ulong *)(p_Var5 + 1) <= prim_id)) {
          local_40 = (Prim *)p_Var5[1]._M_parent;
LAB_002317c8:
          *prim = local_40;
          return true;
        }
      }
    }
    local_40 = (mapped_type)0x0;
    root = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (root != pPVar2) {
      do {
        bVar4 = anon_unknown_28::FindPrimByPrimIdRec(prim_id,root,&local_40,0,in_R8);
        pPVar3 = local_40;
        if (bVar4) {
          ppPVar6 = std::
                    map<unsigned_long,_const_tinyusdz::Prim_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_tinyusdz::Prim_*>_>_>
                    ::operator[](&this->_prim_id_cache,&local_38);
          *ppPVar6 = pPVar3;
          goto LAB_002317c8;
        }
        root = root + 1;
      } while (root != pPVar2);
    }
  }
  return false;
}

Assistant:

bool Stage::find_prim_by_prim_id(const uint64_t prim_id, const Prim *&prim,
                                 std::string *err) const {
  if (prim_id < 1) {
    if (err) {
      (*err) = "Input prim_id must be 1 or greater.";
    }
    return false;
  }

  if (_prim_id_dirty) {
    DCOUT("clear prim_id cache.");
    // Clear cache.
    _prim_id_cache.clear();

    _prim_id_dirty = false;
  } else {
    // First find from a cache.
    auto ret = _prim_id_cache.find(prim_id);
    if (ret != _prim_id_cache.end()) {
      DCOUT("Found cache.");
      prim = ret->second;
      return true;
    }
  }

  const Prim *p{nullptr};
  for (const auto &root : root_prims()) {
    if (FindPrimByPrimIdRec(prim_id, &root, &p, 0, err)) {
      _prim_id_cache[prim_id] = p;
      prim = p;
      return true;
    }
  }

  return false;
}